

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

uint32 google::protobuf::internal::ReadSize(char **pp)

{
  uint uVar1;
  undefined8 *in_RDI;
  pair<const_char_*,_int> pVar2;
  char *unaff_retaddr;
  pair<const_char_*,_int> x;
  uint32 res;
  char *p;
  uint32 in_stack_fffffffffffffffc;
  
  uVar1 = (uint)*(byte *)*in_RDI;
  if (uVar1 < 0x80) {
    *in_RDI = (byte *)*in_RDI + 1;
  }
  else {
    pVar2 = ReadSizeFallback(unaff_retaddr,in_stack_fffffffffffffffc);
    uVar1 = pVar2.second;
    *in_RDI = pVar2.first;
  }
  return uVar1;
}

Assistant:

inline uint32 ReadSize(const char** pp) {
  auto p = *pp;
  uint32 res = static_cast<uint8>(p[0]);
  if (res < 128) {
    *pp = p + 1;
    return res;
  }
  auto x = ReadSizeFallback(p, res);
  *pp = x.first;
  return x.second;
}